

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVmEval.cpp
# Opt level: O2

VmConstant * EvaluateOperand(InstructionVMEvalContext *ctx,VmValue *value)

{
  StackFrame **ppSVar1;
  VmConstant *pVVar2;
  
  ppSVar1 = SmallArray<InstructionVMEvalContext::StackFrame_*,_32U>::back(&ctx->stackFrames);
  if (value != (VmValue *)0x0) {
    switch(value->typeID) {
    case 1:
      return (VmConstant *)value;
    case 2:
      pVVar2 = InstructionVMEvalContext::StackFrame::ReadRegister
                         (*ppSVar1,*(uint *)((long)&value[1]._vptr_VmValue + 4));
      return pVVar2;
    case 3:
      pVVar2 = CreateConstantBlock(ctx->allocator,value->source,(VmBlock *)value);
      return pVVar2;
    case 4:
      pVVar2 = CreateConstantFunction(ctx->allocator,value->source,(VmFunction *)value);
      return pVVar2;
    }
  }
  __assert_fail("!\"unknown type\"",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVmEval.cpp"
                ,0x1d3,"VmConstant *EvaluateOperand(InstructionVMEvalContext &, VmValue *)");
}

Assistant:

VmConstant* EvaluateOperand(InstructionVMEvalContext &ctx, VmValue *value)
{
	InstructionVMEvalContext::StackFrame *frame = ctx.stackFrames.back();

	if(VmConstant *constant = getType<VmConstant>(value))
		return constant;

	if(VmInstruction *instruction = getType<VmInstruction>(value))
		return frame->ReadRegister(instruction->uniqueId);

	if(VmBlock *block = getType<VmBlock>(value))
		return CreateConstantBlock(ctx.allocator, block->source, block);

	if(VmFunction *function = getType<VmFunction>(value))
		return CreateConstantFunction(ctx.allocator, function->source, function);

	assert(!"unknown type");

	return NULL;
}